

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int64_t __thiscall
icu_63::CollationBuilder::getSpecialResetPosition
          (CollationBuilder *this,UnicodeString *str,char **parserErrorReason,UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  uint32_t *puVar3;
  uint *puVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int32_t index;
  uint32_t uVar8;
  char *pcVar9;
  uint uVar10;
  char16_t cVar11;
  uint uVar12;
  char16_t *pcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int64_t iVar17;
  uint uVar18;
  ulong uVar19;
  
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar10 = (str->fUnion).fFields.fLength;
  }
  else {
    uVar10 = (int)sVar1 >> 5;
  }
  cVar11 = L'\xffff';
  if (1 < uVar10) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar13 = (str->fUnion).fFields.fArray;
    }
    else {
      pcVar13 = (char16_t *)((long)&str->fUnion + 2);
    }
    cVar11 = pcVar13[1];
  }
  uVar10 = 0;
  bVar6 = 1;
  switch(cVar11) {
  case L'⠂':
    uVar16 = 0;
    uVar10 = findOrInsertNodeForRootCE(this,0,2,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 0;
    }
    iVar2 = (this->nodes).count;
    if ((int)uVar10 < iVar2 && -1 < (int)uVar10) {
      uVar16 = (ulong)(*(uint *)((this->nodes).elements + uVar10) >> 8 & 0xfffff);
    }
    uVar10 = (uint)uVar16;
    if (((int)uVar10 < iVar2 && uVar10 != 0) &&
       ((*(uint *)((this->nodes).elements + uVar16) & 0xb) == 10)) {
      return ((ulong)((uVar10 & 0x3f) << 0x18) |
             (ulong)(uVar10 & 0x1fc0) << 0x2a | (ulong)(uVar10 & 0xfe000) << 0x2b) +
             0x4040000006002200;
    }
    puVar4 = (this->rootElements).elements;
    return (ulong)(puVar4[*puVar4] & 0xffffff7f);
  case L'⠃':
    puVar3 = (this->rootElements).elements;
    uVar16 = (ulong)(puVar3[puVar3[1] - 1] & 0xffffff7f);
    uVar10 = 2;
    goto LAB_0023eefd;
  case L'⠄':
    uVar10 = 0;
    uVar7 = findOrInsertNodeForRootCE(this,0,1,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = (this->nodes).count;
      if ((int)uVar7 < iVar2 && -1 < (int)uVar7) {
        uVar16 = (this->nodes).elements[uVar7];
      }
      else {
        uVar16 = 0;
      }
      do {
        uVar10 = (uint)(uVar16 >> 8) & 0xfffff;
        if ((uVar16 >> 8 & 0xfffff) == 0) goto LAB_0023eedf;
        if ((int)uVar10 < iVar2) {
          uVar16 = (this->nodes).elements[uVar10];
        }
        else {
          uVar16 = 0;
        }
        if ((uVar16 & 3) == 0) goto LAB_0023eedf;
      } while (((uint)uVar16 & 3) != 1);
      if ((uVar16 & 8) == 0) {
LAB_0023eedf:
        puVar3 = (this->rootElements).elements;
        uVar16 = (ulong)(puVar3[puVar3[1]] & 0xffffff7f);
        uVar10 = 1;
        bVar5 = true;
      }
      else {
        if ((uVar16 & 0x20) != 0) {
          uVar7 = (uint)uVar16 >> 8 & 0xfffff;
          uVar10 = 0;
          if ((int)uVar7 < iVar2) {
            uVar10 = *(uint *)((this->nodes).elements + uVar7) >> 8;
          }
        }
        uVar16 = ((ulong)((uVar10 & 0x3f) << 0x18) |
                 (ulong)(uVar10 & 0x1fc0) << 0x2a | (ulong)(uVar10 & 0xfe000) << 0x2b) +
                 0x4040000006002100;
        uVar10 = 1;
        bVar5 = false;
      }
    }
    else {
      bVar5 = false;
      uVar16 = 0;
    }
    if (!bVar5) {
      return uVar16;
    }
    goto LAB_0023eefd;
  case L'⠅':
    puVar3 = (this->rootElements).elements;
    uVar16 = (ulong)(puVar3[puVar3[2] - 1] & 0xffffff7f);
    uVar10 = 1;
LAB_0023eefd:
    bVar6 = 0;
    break;
  case L'⠆':
    puVar3 = (this->rootElements).elements;
    uVar16 = (ulong)puVar3[puVar3[2]] << 0x20 | 0x5000500;
    break;
  case L'⠇':
    uVar16 = CollationRootElements::lastCEWithPrimaryBefore
                       (&this->rootElements,this->variableTop + 1);
    goto LAB_0023ee5d;
  case L'⠈':
    uVar16 = CollationRootElements::firstCEWithPrimaryAtLeast
                       (&this->rootElements,this->variableTop + 1);
    break;
  case L'⠉':
    uVar8 = CollationData::getFirstPrimaryForGroup(this->baseData,0x11);
    uVar16 = CollationRootElements::firstCEWithPrimaryAtLeast(&this->rootElements,uVar8);
    goto LAB_0023ee5d;
  case L'⠊':
    uVar16 = CollationData::getSingleCE(this->baseData,0x4e00,errorCode);
LAB_0023ee5d:
    bVar6 = 0;
    uVar10 = 0;
    break;
  case L'⠋':
    *errorCode = U_UNSUPPORTED_ERROR;
    pcVar9 = "reset to [last implicit] not supported";
    goto LAB_0023ed88;
  case L'⠌':
    uVar16 = 0xff02020005000500;
    uVar10 = 0;
    break;
  case L'⠍':
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    pcVar9 = "LDML forbids tailoring to U+FFFF";
LAB_0023ed88:
    *parserErrorReason = pcVar9;
  default:
    goto switchD_0023ec86_default;
  }
  uVar7 = findOrInsertNodeForRootCE(this,uVar16,uVar10,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = (this->nodes).count;
    if ((int)uVar7 < iVar2 && -1 < (int)uVar7) {
      uVar19 = (this->nodes).elements[uVar7];
    }
    else {
      uVar19 = 0;
    }
    if ((cVar11 & 1U) == 0) {
      if (!(bool)(bVar6 ^ 1 | (uVar19 & 0x60) != 0)) {
        uVar18 = (uint)(uVar19 >> 8);
        uVar7 = uVar18 & 0xfffff;
        if ((uVar19 >> 8 & 0xfffff) == 0) {
          uVar8 = (uint32_t)(uVar16 >> 0x20);
          index = CollationRootElements::findPrimary(&this->rootElements,uVar8);
          uVar8 = CollationRootElements::getPrimaryAfter
                            (&this->rootElements,uVar8,index,
                             this->baseData->compressibleBytes[uVar16 >> 0x38]);
          uVar7 = 0;
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            uVar7 = findOrInsertNodeForPrimary(this,uVar8,errorCode);
          }
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            uVar19 = 0;
            if ((-1 < (int)uVar7) && ((int)uVar7 < (this->nodes).count)) {
              uVar19 = (this->nodes).elements[uVar7];
            }
          }
          else {
            uVar16 = 0;
          }
          if (U_ZERO_ERROR < *errorCode) {
            return uVar16;
          }
          uVar16 = (ulong)uVar8 << 0x20 | 0x5000500;
        }
        else {
          if ((int)uVar7 < iVar2) {
            uVar19 = (this->nodes).elements[uVar7];
          }
          else {
            uVar19 = 0;
          }
          uVar16 = ((ulong)(uVar10 << 8) | (ulong)(uVar18 & 0xfe000) << 0x2b |
                    (ulong)(uVar18 & 0x1fc0) << 0x2a | (ulong)((uVar18 & 0x3f) << 0x18)) +
                   0x4040000006002000;
        }
      }
      if ((uVar19 & 0x60) == 0) {
        return uVar16;
      }
      if ((uVar19 & 0x40) != 0) {
        uVar18 = (uint)(uVar19 >> 8) & 0xfffff;
        iVar2 = (this->nodes).count;
        uVar7 = 0;
        if ((int)uVar18 < iVar2) {
          uVar7 = *(uint *)((this->nodes).elements + uVar18) >> 8 & 0xfffff;
        }
        if ((int)uVar7 < iVar2) {
          uVar19 = (this->nodes).elements[uVar7];
        }
        else {
          uVar19 = 0;
        }
      }
      if ((uVar19 & 0x20) != 0) {
        uVar18 = (uint)(uVar19 >> 8) & 0xfffff;
        uVar7 = 0;
        if ((int)uVar18 < (this->nodes).count) {
          uVar7 = *(uint *)((this->nodes).elements + uVar18) >> 8;
        }
      }
    }
    else {
      uVar18 = uVar7;
      do {
        uVar12 = (uint)(uVar19 >> 8) & 0xfffff;
        if ((uVar19 & 0xfffff00) == 0) {
          bVar5 = false;
        }
        else {
          if ((int)uVar12 < iVar2) {
            uVar15 = (this->nodes).elements[uVar12];
          }
          else {
            uVar15 = 0;
          }
          uVar14 = (uint)uVar15 & 3;
          bVar5 = uVar10 <= uVar14;
          uVar7 = uVar18;
          if (uVar10 <= uVar14) {
            uVar19 = uVar15;
            uVar7 = uVar12;
            uVar18 = uVar12;
          }
        }
      } while (bVar5);
      if ((uVar19 & 8) == 0) {
        return uVar16;
      }
    }
    iVar17 = ((ulong)(uVar10 << 8) | (ulong)(uVar7 & 0xfe000) << 0x2b |
              (ulong)(uVar7 & 0x1fc0) << 0x2a | (ulong)((uVar7 & 0x3f) << 0x18)) +
             0x4040000006002000;
  }
  else {
switchD_0023ec86_default:
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

int64_t
CollationBuilder::getSpecialResetPosition(const UnicodeString &str,
                                          const char *&parserErrorReason, UErrorCode &errorCode) {
    U_ASSERT(str.length() == 2);
    int64_t ce;
    int32_t strength = UCOL_PRIMARY;
    UBool isBoundary = FALSE;
    UChar32 pos = str.charAt(1) - CollationRuleParser::POS_BASE;
    U_ASSERT(0 <= pos && pos <= CollationRuleParser::LAST_TRAILING);
    switch(pos) {
    case CollationRuleParser::FIRST_TERTIARY_IGNORABLE:
        // Quaternary CEs are not supported.
        // Non-zero quaternary weights are possible only on tertiary or stronger CEs.
        return 0;
    case CollationRuleParser::LAST_TERTIARY_IGNORABLE:
        return 0;
    case CollationRuleParser::FIRST_SECONDARY_IGNORABLE: {
        // Look for a tailored tertiary node after [0, 0, 0].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_TERTIARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        if((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            U_ASSERT(strengthFromNode(node) <= UCOL_TERTIARY);
            if(isTailoredNode(node) && strengthFromNode(node) == UCOL_TERTIARY) {
                return tempCEFromIndexAndStrength(index, UCOL_TERTIARY);
            }
        }
        return rootElements.getFirstTertiaryCE();
        // No need to look for nodeHasAnyBefore() on a tertiary node.
    }
    case CollationRuleParser::LAST_SECONDARY_IGNORABLE:
        ce = rootElements.getLastTertiaryCE();
        strength = UCOL_TERTIARY;
        break;
    case CollationRuleParser::FIRST_PRIMARY_IGNORABLE: {
        // Look for a tailored secondary node after [0, 0, *].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_SECONDARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        while((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            strength = strengthFromNode(node);
            if(strength < UCOL_SECONDARY) { break; }
            if(strength == UCOL_SECONDARY) {
                if(isTailoredNode(node)) {
                    if(nodeHasBefore3(node)) {
                        index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                        U_ASSERT(isTailoredNode(nodes.elementAti(index)));
                    }
                    return tempCEFromIndexAndStrength(index, UCOL_SECONDARY);
                } else {
                    break;
                }
            }
        }
        ce = rootElements.getFirstSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    }
    case CollationRuleParser::LAST_PRIMARY_IGNORABLE:
        ce = rootElements.getLastSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    case CollationRuleParser::FIRST_VARIABLE:
        ce = rootElements.getFirstPrimaryCE();
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 00A0, SPACE first primary
        break;
    case CollationRuleParser::LAST_VARIABLE:
        ce = rootElements.lastCEWithPrimaryBefore(variableTop + 1);
        break;
    case CollationRuleParser::FIRST_REGULAR:
        ce = rootElements.firstCEWithPrimaryAtLeast(variableTop + 1);
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 263A, SYMBOL first primary
        break;
    case CollationRuleParser::LAST_REGULAR:
        // Use the Hani-first-primary rather than the actual last "regular" CE before it,
        // for backward compatibility with behavior before the introduction of
        // script-first-primary CEs in the root collator.
        ce = rootElements.firstCEWithPrimaryAtLeast(
            baseData->getFirstPrimaryForGroup(USCRIPT_HAN));
        break;
    case CollationRuleParser::FIRST_IMPLICIT:
        ce = baseData->getSingleCE(0x4e00, errorCode);
        break;
    case CollationRuleParser::LAST_IMPLICIT:
        // We do not support tailoring to an unassigned-implicit CE.
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "reset to [last implicit] not supported";
        return 0;
    case CollationRuleParser::FIRST_TRAILING:
        ce = Collation::makeCE(Collation::FIRST_TRAILING_PRIMARY);
        isBoundary = TRUE;  // trailing first primary (there is no mapping for it)
        break;
    case CollationRuleParser::LAST_TRAILING:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        parserErrorReason = "LDML forbids tailoring to U+FFFF";
        return 0;
    default:
        U_ASSERT(FALSE);
        return 0;
    }

    int32_t index = findOrInsertNodeForRootCE(ce, strength, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    int64_t node = nodes.elementAti(index);
    if((pos & 1) == 0) {
        // even pos = [first xyz]
        if(!nodeHasAnyBefore(node) && isBoundary) {
            // A <group> first primary boundary is artificially added to FractionalUCA.txt.
            // It is reachable via its special contraction, but is not normally used.
            // Find the first character tailored after the boundary CE,
            // or the first real root CE after it.
            if((index = nextIndexFromNode(node)) != 0) {
                // If there is a following node, then it must be tailored
                // because there are no root CEs with a boundary primary
                // and non-common secondary/tertiary weights.
                node = nodes.elementAti(index);
                U_ASSERT(isTailoredNode(node));
                ce = tempCEFromIndexAndStrength(index, strength);
            } else {
                U_ASSERT(strength == UCOL_PRIMARY);
                uint32_t p = (uint32_t)(ce >> 32);
                int32_t pIndex = rootElements.findPrimary(p);
                UBool isCompressible = baseData->isCompressiblePrimary(p);
                p = rootElements.getPrimaryAfter(p, pIndex, isCompressible);
                ce = Collation::makeCE(p);
                index = findOrInsertNodeForRootCE(ce, UCOL_PRIMARY, errorCode);
                if(U_FAILURE(errorCode)) { return 0; }
                node = nodes.elementAti(index);
            }
        }
        if(nodeHasAnyBefore(node)) {
            // Get the first node that was tailored before this one at a weaker strength.
            if(nodeHasBefore2(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                node = nodes.elementAti(index);
            }
            if(nodeHasBefore3(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
            }
            U_ASSERT(isTailoredNode(nodes.elementAti(index)));
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    } else {
        // odd pos = [last xyz]
        // Find the last node that was tailored after the [last xyz]
        // at a strength no greater than the position's strength.
        for(;;) {
            int32_t nextIndex = nextIndexFromNode(node);
            if(nextIndex == 0) { break; }
            int64_t nextNode = nodes.elementAti(nextIndex);
            if(strengthFromNode(nextNode) < strength) { break; }
            index = nextIndex;
            node = nextNode;
        }
        // Do not make a temporary CE for a root node.
        // This last node might be the node for the root CE itself,
        // or a node with a common secondary or tertiary weight.
        if(isTailoredNode(node)) {
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    }
    return ce;
}